

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Mat3 *matrixArray,size_t length)

{
  bool bVar1;
  reference pvVar2;
  ulong in_RCX;
  long in_RDX;
  size_type in_RDI;
  UniformBinder binder;
  size_t i;
  vector<float,_std::allocator<float>_> contiguous;
  size_t matrixSize;
  size_t in_stack_ffffffffffffff58;
  UniformBinder *in_stack_ffffffffffffff60;
  allocator_type *in_stack_ffffffffffffff70;
  string *name_00;
  Shader *shader;
  UniformBinder *in_stack_ffffffffffffff90;
  int local_64;
  ulong local_60;
  undefined1 local_41 [25];
  undefined8 local_28;
  ulong local_20;
  long local_18;
  
  local_28 = 9;
  name_00 = (string *)(in_RCX * 9);
  shader = (Shader *)local_41;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<float>::allocator((allocator<float> *)0x1fa180);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)name_00,in_RDI,in_stack_ffffffffffffff70);
  std::allocator<float>::~allocator((allocator<float> *)0x1fa1a0);
  for (local_60 = 0; local_60 < local_20; local_60 = local_60 + 1) {
    in_stack_ffffffffffffff70 = (allocator_type *)(local_18 + local_60 * 0x24);
    std::vector<float,_std::allocator<float>_>::operator[]
              ((vector<float,_std::allocator<float>_> *)(local_41 + 1),local_60 * 9);
    priv::copyMatrix((float *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(float *)0x1fa1ee)
    ;
  }
  UniformBinder::UniformBinder(in_stack_ffffffffffffff90,shader,name_00);
  if (local_64 != -1) {
    in_stack_ffffffffffffff60 = (UniformBinder *)sf_glad_glUniformMatrix3fvARB;
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff70);
    if (bVar1) {
      pvVar2 = (reference)0x0;
    }
    else {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_41 + 1),0);
    }
    (*(code *)in_stack_ffffffffffffff60)(local_64,local_20 & 0xffffffff,0,pvVar2);
  }
  UniformBinder::~UniformBinder(in_stack_ffffffffffffff60);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Mat3* matrixArray, std::size_t length)
{
    const std::size_t matrixSize = 3 * 3;

    std::vector<float> contiguous(matrixSize * length);
    for (std::size_t i = 0; i < length; ++i)
        priv::copyMatrix(matrixArray[i].array, matrixSize, &contiguous[matrixSize * i]);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniformMatrix3fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, !contiguous.empty() ? &contiguous[0] : NULL));
}